

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codaeval.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  undefined8 uVar7;
  FILE *__stream;
  char *pcVar8;
  size_t sStack_40;
  
  if (argc != 1) {
    pcVar8 = argv[1];
    cVar1 = *pcVar8;
    if (((cVar1 != '-') || (pcVar8[1] != 'h')) || (pcVar8[2] != '\0')) {
      iVar4 = strcmp(pcVar8,"--help");
      if (iVar4 != 0) {
        if (((cVar1 != '-') || (pcVar8[1] != 'v')) || (pcVar8[2] != '\0')) {
          iVar4 = strcmp(pcVar8,"--version");
          if (iVar4 != 0) {
            if (((argc < 3 || cVar1 != '-') || (pcVar8[1] != 'D')) || (pcVar8[2] != '\0')) {
              iVar4 = coda_set_definition_path_conditional(*argv,0,"../share/coda/definitions");
              if (iVar4 != 0) {
LAB_001017ba:
                __stream = _stderr;
                puVar6 = (undefined4 *)coda_get_errno();
                uVar7 = coda_errno_to_string(*puVar6);
                pcVar8 = "ERROR: %s\n";
LAB_001017ab:
                fprintf(__stream,pcVar8,uVar7);
                goto LAB_00101786;
              }
              iVar4 = 1;
            }
            else {
              coda_set_definition_path(argv[2]);
              iVar4 = 3;
            }
            uVar3 = 1;
            bVar2 = false;
            for (; iVar4 < argc; iVar4 = iVar4 + 1) {
              pcVar8 = argv[iVar4];
              cVar1 = *pcVar8;
              if (((cVar1 == '-') && (pcVar8[1] == 'c')) && (pcVar8[2] == '\0')) {
LAB_0010164e:
                bVar2 = true;
              }
              else {
                iVar5 = strcmp(pcVar8,"--check");
                if (iVar5 == 0) goto LAB_0010164e;
                if (((cVar1 == '-') && (pcVar8[1] == 'd')) && (pcVar8[2] == '\0')) {
LAB_00101657:
                  uVar3 = 0;
                }
                else {
                  iVar5 = strcmp(pcVar8,"--disable_conversions");
                  if (iVar5 == 0) goto LAB_00101657;
                  if (cVar1 != '-') {
                    iVar5 = coda_expression_from_string(pcVar8,&eval_expr);
                    __stream = _stderr;
                    if (iVar5 != 0) {
                      puVar6 = (undefined4 *)coda_get_errno();
                      uVar7 = coda_errno_to_string(*puVar6);
                      pcVar8 = "ERROR: error in expression: %s\n";
                      goto LAB_001017ab;
                    }
                    iVar5 = coda_expression_get_type(eval_expr,&expr_type);
                    __stream = _stderr;
                    if (iVar5 != 0) goto LAB_001017ba;
                    if ((expr_type & ~coda_expression_integer) == coda_expression_node) {
                      uVar7 = coda_expression_get_type_name();
                      pcVar8 = "ERROR: expression cannot be a \'%s\' expression\n";
                      goto LAB_001017ab;
                    }
                    if (!bVar2) {
                      iVar4 = iVar4 + 1;
                      if (argc - iVar4 == 0 || argc < iVar4) {
                        if (node_expr == (coda_expression *)0x0) {
                          iVar4 = coda_expression_is_constant();
                          if (iVar4 != 0) {
                            iVar4 = eval_expression((coda_cursor *)0x0);
                            if (iVar4 == 0) goto LAB_00101727;
                            goto LAB_001017ba;
                          }
                          pcVar8 = 
                          "ERROR: invalid arguments (file/directory list needs to be provided if expression is not a constant expression)\n"
                          ;
                          sStack_40 = 0x6f;
                        }
                        else {
                          pcVar8 = 
                          "ERROR: invalid arguments (path expression is only allowed if a file/directory list is provided)\n"
                          ;
                          sStack_40 = 0x60;
                        }
                        fwrite(pcVar8,sStack_40,1,_stderr);
                        goto LAB_00101786;
                      }
                      iVar5 = coda_init();
                      if (iVar5 != 0) goto LAB_001017ba;
                      coda_set_option_perform_conversions(uVar3);
                      iVar4 = coda_match_filefilter(0,argc - iVar4,argv + iVar4,callback,0);
                      if (iVar4 != 0) goto LAB_001017ba;
                      coda_done();
                    }
LAB_00101727:
                    coda_expression_delete(eval_expr);
                    if (node_expr != (coda_expression *)0x0) {
                      coda_expression_delete();
                    }
                    return 0;
                  }
                  if (((pcVar8[1] != 'p') || (pcVar8[2] != '\0')) ||
                     ((iVar4 = iVar4 + 1, argc <= iVar4 || (*argv[iVar4] == '-')))) break;
                  iVar5 = coda_expression_from_string(argv[iVar4],&node_expr);
                  __stream = _stderr;
                  if (iVar5 != 0) {
                    puVar6 = (undefined4 *)coda_get_errno();
                    uVar7 = coda_errno_to_string(*puVar6);
                    pcVar8 = "ERROR: error in path expression: %s\n";
                    goto LAB_001017ab;
                  }
                }
              }
            }
            fwrite("ERROR: invalid arguments\n",0x19,1,_stderr);
            print_help();
LAB_00101786:
            exit(1);
          }
        }
        print_version();
        goto LAB_001017e5;
      }
    }
  }
  print_help();
LAB_001017e5:
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    int perform_conversions;
    int check_only;
    int i;

    perform_conversions = 1;
    check_only = 0;

    if (argc == 1 || strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "--help") == 0)
    {
        print_help();
        exit(0);
    }

    if (strcmp(argv[1], "-v") == 0 || strcmp(argv[1], "--version") == 0)
    {
        print_version();
        exit(0);
    }

    i = 1;
    if (i + 1 < argc && strcmp(argv[i], "-D") == 0)
    {
        coda_set_definition_path(argv[i + 1]);
        i += 2;
    }
    else
    {
        const char *definition_path = "../share/" PACKAGE "/definitions";

        if (coda_set_definition_path_conditional(argv[0], NULL, definition_path) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    while (i < argc)
    {
        if (strcmp(argv[i], "-c") == 0 || strcmp(argv[i], "--check") == 0)
        {
            check_only = 1;
        }
        else if (strcmp(argv[i], "-d") == 0 || strcmp(argv[i], "--disable_conversions") == 0)
        {
            perform_conversions = 0;
        }
        else if (strcmp(argv[i], "-p") == 0 && i + 1 < argc && argv[i + 1][0] != '-')
        {
            if (coda_expression_from_string(argv[i + 1], &node_expr))
            {
                fprintf(stderr, "ERROR: error in path expression: %s\n", coda_errno_to_string(coda_errno));
                exit(1);
            }
            i++;
        }
        else if (argv[i][0] != '-')
        {
            /* assume all arguments from here on are the expression and the optional list of files/directories */
            break;
        }
        else
        {
            fprintf(stderr, "ERROR: invalid arguments\n");
            print_help();
            exit(1);
        }
        i++;
    }

    /* expression parameter */
    if (i >= argc)
    {
        fprintf(stderr, "ERROR: invalid arguments\n");
        print_help();
        exit(1);
    }
    if (coda_expression_from_string(argv[i], &eval_expr) != 0)
    {
        fprintf(stderr, "ERROR: error in expression: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }
    i++;

    if (coda_expression_get_type(eval_expr, &expr_type) != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }
    if (expr_type == coda_expression_node || expr_type == coda_expression_void)
    {
        fprintf(stderr, "ERROR: expression cannot be a '%s' expression\n", coda_expression_get_type_name(expr_type));
        exit(1);
    }

    if (check_only)
    {
        coda_expression_delete(eval_expr);
        if (node_expr != NULL)
        {
            coda_expression_delete(node_expr);
        }

        return 0;
    }

    if (i < argc)
    {
        if (coda_init() != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }

        coda_set_option_perform_conversions(perform_conversions);

        if (coda_match_filefilter(NULL, argc - i, (const char **)&argv[i], &callback, NULL) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }

        coda_done();
    }
    else
    {
        if (node_expr != NULL)
        {
            fprintf(stderr, "ERROR: invalid arguments (path expression is only allowed if a file/directory list is "
                    "provided)\n");
            exit(1);
        }
        if (!coda_expression_is_constant(eval_expr))
        {
            fprintf(stderr, "ERROR: invalid arguments (file/directory list needs to be provided if expression is not "
                    "a constant expression)\n");
            exit(1);
        }
        if (eval_expression(NULL) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    coda_expression_delete(eval_expr);
    if (node_expr != NULL)
    {
        coda_expression_delete(node_expr);
    }

    return 0;
}